

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool __thiscall
MeCab::EncoderFeatureIndex::reopen
          (EncoderFeatureIndex *this,char *filename,char *dic_charset,
          vector<double,_std::allocator<double>_> *alpha,Param *param)

{
  pointer pdVar1;
  size_t sVar2;
  iterator __position;
  char *pcVar3;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *p_Var4;
  EncoderFeatureIndex *pEVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *__s;
  long *plVar9;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  ulong uVar13;
  char **ppcVar14;
  char *pcVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  char *pcVar17;
  string model_charset;
  Iconv iconv;
  string feature;
  char *column [8];
  ifstream ifs;
  die local_312;
  die local_311;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_310;
  char *local_308;
  char *local_300;
  char local_2f8 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2e8;
  vector<double,_std::allocator<double>_> *local_2c0;
  uint local_2b4;
  EncoderFeatureIndex *local_2b0;
  Iconv local_2a8;
  string local_298;
  char *local_278 [8];
  long local_238 [4];
  uint auStack_218 [122];
  
  (*(this->super_FeatureIndex)._vptr_FeatureIndex[2])();
  std::ifstream::ifstream(local_238,filename,_S_in);
  uVar8 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
  if ((uVar8 & 5) == 0) {
    local_2c0 = alpha;
    local_2b4 = uVar8;
    local_2b0 = this;
    __s = (char *)operator_new__(0x2000);
    local_308 = local_2f8;
    local_300 = (char *)0x0;
    local_2f8[0] = '\0';
    local_310 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 *)dic_charset;
    while( true ) {
      std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      plVar9 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
      pEVar5 = local_2b0;
      if (((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) || (*__s == '\0')
         ) break;
      sVar10 = strlen(__s);
      pcVar11 = __s + sVar10;
      ppcVar14 = local_278;
      uVar13 = 0;
      pcVar17 = __s;
      do {
        pcVar3 = pcVar17;
        if (1 < uVar13) break;
        for (; (pcVar15 = pcVar11, pcVar3 != pcVar11 && (pcVar15 = pcVar3, *pcVar3 != ':'));
            pcVar3 = pcVar3 + 1) {
        }
        *pcVar15 = '\0';
        if (*pcVar17 != '\0') {
          *ppcVar14 = pcVar17;
          ppcVar14 = ppcVar14 + 1;
          uVar13 = uVar13 + 1;
        }
        pcVar17 = pcVar15 + 1;
      } while (pcVar15 != pcVar11);
      if (uVar13 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x27b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"tokenize2(buf.get(), \":\", column, 2) == 2",0x29);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"format error: ",0xe);
        sVar10 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar10);
        die::~die((die *)&local_2e8);
      }
      pcVar17 = local_278[0];
      std::__cxx11::string::string((string *)&local_2e8,local_278[0],(allocator *)&local_298);
      iVar7 = std::__cxx11::string::compare((char *)&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.first._M_dataplus._M_p != &local_2e8.first.field_2) {
        operator_delete(local_2e8.first._M_dataplus._M_p);
      }
      pcVar3 = local_278[1];
      pcVar11 = local_300;
      if (iVar7 == 0) {
        pcVar17 = local_278[1] + 1;
        strlen(pcVar17);
        std::__cxx11::string::_M_replace((ulong)&local_308,0,pcVar11,(ulong)pcVar17);
        dic_charset = (char *)local_310;
      }
      else {
        pcVar11 = local_278[1] + 1;
        local_2e8.first._M_dataplus._M_p = (pointer)&local_2e8.first.field_2;
        sVar10 = strlen(pcVar11);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,pcVar11,pcVar3 + sVar10 + 1);
        Param::set<std::__cxx11::string>(param,pcVar17,&local_2e8.first,true);
        dic_charset = (char *)local_310;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8.first._M_dataplus._M_p != &local_2e8.first.field_2) {
          operator_delete(local_2e8.first._M_dataplus._M_p);
        }
      }
    }
    if (dic_charset == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x284);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dic_charset",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_2e8);
    }
    if (local_300 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x285);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!model_charset.empty()",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"charset is empty",0x10);
      die::~die((die *)&local_2e8);
    }
    Iconv::Iconv(&local_2a8);
    iVar7 = Iconv::open(&local_2a8,local_308,(int)dic_charset);
    pvVar16 = local_2c0;
    if ((char)iVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x288);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"iconv.open(model_charset.c_str(), dic_charset)",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"cannot create model from=",0x19);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_308,(long)local_300);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," to=",4);
      p_Var4 = local_310;
      if (local_310 ==
          (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar10 = strlen((char *)local_310);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)p_Var4,sVar10);
      }
      pvVar16 = local_2c0;
      die::~die(&local_311);
    }
    pdVar1 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish = pdVar1;
    }
    if ((pEVar5->super_FeatureIndex).maxid_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"maxid_ == 0",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_2e8);
    }
    if ((pEVar5->dic_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x28e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"dic_.empty()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
      die::~die((die *)&local_2e8);
    }
    pvVar16 = local_2c0;
    local_310 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 *)&pEVar5->dic_;
    while( true ) {
      std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
      plVar9 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
      if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) break;
      sVar10 = strlen(__s);
      pcVar11 = __s + sVar10;
      ppcVar14 = local_278;
      uVar13 = 0;
      pcVar17 = __s;
      do {
        pcVar3 = pcVar17;
        if (1 < uVar13) break;
        for (; (pcVar15 = pcVar11, pcVar3 != pcVar11 && (pcVar15 = pcVar3, *pcVar3 != '\t'));
            pcVar3 = pcVar3 + 1) {
        }
        *pcVar15 = '\0';
        if (*pcVar17 != '\0') {
          *ppcVar14 = pcVar17;
          ppcVar14 = ppcVar14 + 1;
          uVar13 = uVar13 + 1;
        }
        pcVar17 = pcVar15 + 1;
      } while (pcVar15 != pcVar11);
      if (uVar13 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x291);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"tokenize2(buf.get(), \"\\t\", column, 2) == 2",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"format error: ",0xe);
        sVar10 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar10);
        die::~die((die *)&local_2e8);
      }
      std::__cxx11::string::string((string *)&local_298,local_278[1],(allocator *)&local_2e8);
      bVar6 = Iconv::convert(&local_2a8,&local_298);
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x294);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"iconv.convert(&feature)",0x17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
        if (!bVar6) {
          die::~die(&local_312);
        }
      }
      sVar2 = (local_2b0->super_FeatureIndex).maxid_;
      (local_2b0->super_FeatureIndex).maxid_ = sVar2 + 1;
      local_2e8.first._M_dataplus._M_p = (pointer)&local_2e8.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      local_2e8.second = sVar2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_long>>(local_310,&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.first._M_dataplus._M_p != &local_2e8.first.field_2) {
        operator_delete(local_2e8.first._M_dataplus._M_p);
      }
      local_2e8.first._M_dataplus._M_p = (pointer)atof(local_278[0]);
      __position._M_current =
           (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar16,__position,(double *)&local_2e8);
      }
      else {
        *__position._M_current = (double)local_2e8.first._M_dataplus._M_p;
        (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
    }
    Iconv::~Iconv(&local_2a8);
    if (local_308 != local_2f8) {
      operator_delete(local_308);
    }
    operator_delete__(__s);
    uVar8 = local_2b4;
  }
  std::ifstream::~ifstream(local_238);
  return (uVar8 & 5) == 0;
}

Assistant:

bool EncoderFeatureIndex::reopen(const char *filename,
                                 const char *dic_charset,
                                 std::vector<double> *alpha,
                                 Param *param) {
  close();
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    return false;
  }

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[8];

  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    } else {
      param->set<std::string>(column[0], column[1] + 1, true);
    }
  }

  CHECK_DIE(dic_charset);
  CHECK_DIE(!model_charset.empty()) << "charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(model_charset.c_str(), dic_charset))
      << "cannot create model from=" << model_charset
      << " to=" << dic_charset;

  alpha->clear();
  CHECK_DIE(maxid_ == 0);
  CHECK_DIE(dic_.empty());

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    dic_.insert(std::make_pair(feature, maxid_++));
    alpha->push_back(atof(column[0]));
  }

  return true;
}